

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  InternalRunDeathTestFlag *pIVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  pointer __s;
  int *piVar9;
  void *__addr;
  size_type *psVar10;
  __sighandler_t p_Var11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong *puVar13;
  long lVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  undefined8 uVar16;
  long lVar17;
  ulong uVar18;
  size_t __len;
  int pipe_fd [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  int death_test_index;
  ExecDeathTestArgs args_2;
  string internal_flag;
  sigaction saved_sigprof_action;
  string filter_flag;
  sigaction ignore_sigprof_action;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  string local_210;
  int local_1f0;
  int local_1ec;
  string local_1e8;
  int local_1c8 [2];
  string local_1c0;
  value_type local_1a0;
  _union_1457 local_180;
  long local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [8];
  value_type local_e8;
  _union_1457 local_c8;
  undefined1 local_c0 [8];
  ulong local_b8;
  ulong uStack_b0;
  
  UnitTest::GetInstance();
  pIVar3 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_1c8[0] = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
                 death_test_count_;
  if (pIVar3 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    return EXECUTE_TEST;
  }
  iVar5 = pipe(&local_1f0);
  if (iVar5 == -1) {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_2b0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2b0._M_dataplus._M_p == psVar10) {
      local_2b0.field_2._M_allocated_capacity = *psVar10;
      local_2b0.field_2._8_8_ = plVar7[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *psVar10;
    }
    local_2b0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    local_2d0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2d0._M_dataplus._M_p == psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = plVar7[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
    }
    local_2d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x555;
    StreamableToString<int>(&local_290,(int *)&local_250);
    std::operator+(&local_2f0,&local_2d0,&local_290);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    local_c8.sa_handler = (__sighandler_t)*plVar7;
    p_Var11 = (__sighandler_t)(plVar7 + 2);
    if (local_c8.sa_handler == p_Var11) {
      local_b8 = *(ulong *)p_Var11;
      uStack_b0 = plVar7[3];
      local_c8.sa_handler = (__sighandler_t)&local_b8;
    }
    else {
      local_b8 = *(ulong *)p_Var11;
    }
    local_c0 = (undefined1  [8])plVar7[1];
    *plVar7 = (long)p_Var11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_180.sa_handler = (__sighandler_t)*plVar7;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler == paVar15) {
      local_170[0]._0_8_ = paVar15->_M_allocated_capacity;
      local_170[0]._8_8_ = plVar7[3];
      local_180.sa_handler = (__sighandler_t)local_170;
    }
    else {
      local_170[0]._0_8_ = paVar15->_M_allocated_capacity;
    }
    local_178 = plVar7[1];
    *plVar7 = (long)paVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    DeathTestAbort((string *)&local_180);
  }
  iVar5 = fcntl(local_1ec,2,0);
  if (iVar5 == -1) {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_2b0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2b0._M_dataplus._M_p == psVar10) {
      local_2b0.field_2._M_allocated_capacity = *psVar10;
      local_2b0.field_2._8_8_ = plVar7[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *psVar10;
    }
    local_2b0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    local_2d0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2d0._M_dataplus._M_p == psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = plVar7[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
    }
    local_2d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x558;
    StreamableToString<int>(&local_290,(int *)&local_250);
    std::operator+(&local_2f0,&local_2d0,&local_290);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    local_c8.sa_handler = (__sighandler_t)*plVar7;
    p_Var11 = (__sighandler_t)(plVar7 + 2);
    if (local_c8.sa_handler == p_Var11) {
      local_b8 = *(ulong *)p_Var11;
      uStack_b0 = plVar7[3];
      local_c8.sa_handler = (__sighandler_t)&local_b8;
    }
    else {
      local_b8 = *(ulong *)p_Var11;
    }
    local_c0 = (undefined1  [8])plVar7[1];
    *plVar7 = (long)p_Var11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
    local_180.sa_handler = (__sighandler_t)*plVar7;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler == paVar15) {
      local_170[0]._0_8_ = paVar15->_M_allocated_capacity;
      local_170[0]._8_8_ = plVar7[3];
      local_180.sa_handler = (__sighandler_t)local_170;
    }
    else {
      local_170[0]._0_8_ = paVar15->_M_allocated_capacity;
    }
    local_178 = plVar7[1];
    *plVar7 = (long)paVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    DeathTestAbort((string *)&local_180);
  }
  paVar15 = &local_2b0.field_2;
  local_2b0._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"--","");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  paVar2 = &local_2d0.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2d0.field_2._M_allocated_capacity = *psVar10;
    local_2d0.field_2._8_8_ = plVar7[3];
    local_2d0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar10;
    local_2d0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2d0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2f0.field_2._M_allocated_capacity = *psVar10;
    local_2f0.field_2._8_8_ = plVar7[3];
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = *psVar10;
    local_2f0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2f0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  p_Var11 = (__sighandler_t)(plVar7 + 2);
  if ((__sighandler_t)*plVar7 == p_Var11) {
    local_b8 = *(ulong *)p_Var11;
    uStack_b0 = plVar7[3];
    local_c8.sa_handler = (__sighandler_t)&local_b8;
  }
  else {
    local_b8 = *(ulong *)p_Var11;
    local_c8.sa_handler = (__sighandler_t)*plVar7;
  }
  local_c0 = (undefined1  [8])plVar7[1];
  *plVar7 = (long)p_Var11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_180.sa_handler = (__sighandler_t)local_170;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar12) {
    local_170[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_170[0]._8_8_ = plVar7[3];
  }
  else {
    local_170[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_180.sa_handler = (__sighandler_t)*plVar7;
  }
  local_178 = plVar7[1];
  *plVar7 = (long)paVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_180);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_e8.field_2._M_allocated_capacity = *psVar10;
    local_e8.field_2._8_8_ = plVar7[3];
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar10;
    local_e8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_e8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != local_170) {
    operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
  }
  if (local_c8.sa_handler != (__sighandler_t)&local_b8) {
    operator_delete(local_c8.sa_handler,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar15) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_250.field_2._M_allocated_capacity = *psVar10;
    local_250.field_2._8_8_ = plVar7[3];
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *psVar10;
    local_250._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_250._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_290.field_2._M_allocated_capacity = *psVar10;
    local_290.field_2._8_8_ = plVar7[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *psVar10;
    local_290._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_290._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_290);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_270.field_2._M_allocated_capacity = *psVar10;
    local_270.field_2._8_8_ = plVar7[3];
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = *psVar10;
    local_270._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_270._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
  puVar13 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_2b0.field_2._M_allocated_capacity = *puVar13;
    local_2b0.field_2._8_8_ = plVar7[3];
    local_2b0._M_dataplus._M_p = (pointer)paVar15;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = *puVar13;
    local_2b0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2b0._M_string_length = plVar7[1];
  *plVar7 = (long)puVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  StreamableToString<int>(&local_210,&this->line_);
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar15) {
    uVar16 = local_2b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < local_210._M_string_length + local_2b0._M_string_length) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_) !=
        &local_210.field_2) {
      uVar16 = local_210.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_210._M_string_length + local_2b0._M_string_length) goto LAB_00123059;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_210,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
  }
  else {
LAB_00123059:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_2b0,
                        CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_))
    ;
  }
  psVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2d0.field_2._M_allocated_capacity = *psVar10;
    local_2d0.field_2._8_8_ = puVar8[3];
    local_2d0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar10;
    local_2d0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_2d0._M_string_length = puVar8[1];
  *puVar8 = psVar10;
  puVar8[1] = 0;
  *(undefined1 *)psVar10 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  puVar13 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_2f0.field_2._M_allocated_capacity = *puVar13;
    local_2f0.field_2._8_8_ = plVar7[3];
  }
  else {
    local_2f0.field_2._M_allocated_capacity = *puVar13;
    local_2f0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2f0._M_string_length = plVar7[1];
  *plVar7 = (long)puVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  StreamableToString<int>(&local_1e8,local_1c8);
  uVar16 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    uVar16 = local_2f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar16 < (pointer)(local_1e8._M_string_length + local_2f0._M_string_length)) {
    uVar16 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar16 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < (pointer)(local_1e8._M_string_length + local_2f0._M_string_length))
    goto LAB_0012317d;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_1e8,0,(char *)0x0,(ulong)local_2f0._M_dataplus._M_p);
  }
  else {
LAB_0012317d:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_1e8._M_dataplus._M_p);
  }
  local_c8.sa_handler = (__sighandler_t)&local_b8;
  p_Var11 = (__sighandler_t)(puVar8 + 2);
  if ((__sighandler_t)*puVar8 == p_Var11) {
    local_b8 = *(ulong *)p_Var11;
    uStack_b0 = puVar8[3];
  }
  else {
    local_b8 = *(ulong *)p_Var11;
    local_c8.sa_handler = (__sighandler_t)*puVar8;
  }
  local_c0 = (undefined1  [8])puVar8[1];
  *puVar8 = p_Var11;
  puVar8[1] = 0;
  *p_Var11 = (__sighandler_t)0x0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_180.sa_handler = (__sighandler_t)local_170;
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar12) {
    local_170[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_170[0]._8_8_ = plVar7[3];
  }
  else {
    local_170[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_180.sa_handler = (__sighandler_t)*plVar7;
  }
  local_178 = plVar7[1];
  *plVar7 = (long)paVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  StreamableToString<int>(&local_1c0,&local_1ec);
  uVar18 = CONCAT44(local_1c0._M_string_length._4_4_,(int)local_1c0._M_string_length) + local_178;
  uVar16 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != local_170) {
    uVar16 = local_170[0]._M_allocated_capacity;
  }
  if ((ulong)uVar16 < uVar18) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      uVar16 = local_1c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < uVar18) goto LAB_001232d2;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,(ulong)local_180);
  }
  else {
LAB_001232d2:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1c0._M_dataplus._M_p);
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  psVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1a0.field_2._M_allocated_capacity = *psVar10;
    local_1a0.field_2._8_8_ = puVar8[3];
  }
  else {
    local_1a0.field_2._M_allocated_capacity = *psVar10;
    local_1a0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_1a0._M_string_length = puVar8[1];
  *puVar8 = psVar10;
  puVar8[1] = 0;
  *(undefined1 *)psVar10 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != local_170) {
    operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
  }
  if (local_c8.sa_handler != (__sighandler_t)&local_b8) {
    operator_delete(local_c8.sa_handler,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,(ulong)(local_1e8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_) !=
      &local_210.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_),
                    local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar15) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  GetInjectableArgvs_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1e8,&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1e8,&local_1a0);
  local_180.sa_handler = (__sighandler_t)local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != local_170) {
    operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
  }
  CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
  fflush((FILE *)0x0);
  lVar17 = (long)(local_1e8._M_string_length - (long)local_1e8._M_dataplus._M_p) >> 5;
  uVar18 = -(ulong)(lVar17 + 1U >> 0x3d != 0) | lVar17 * 8 + 8U;
  __s = (pointer)operator_new__(uVar18);
  memset(__s,0,uVar18);
  if ((pointer)local_1e8._M_string_length != local_1e8._M_dataplus._M_p) {
    lVar14 = 0;
    do {
      *(undefined8 *)(__s + lVar14 * 8) = *(undefined8 *)local_1e8._M_dataplus._M_p;
      lVar14 = lVar14 + 1;
      local_1e8._M_dataplus._M_p = local_1e8._M_dataplus._M_p + 0x20;
    } while (lVar17 + (ulong)(lVar17 == 0) != lVar14);
  }
  pcVar1 = __s + lVar17 * 8;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  local_1c0._M_string_length._0_4_ = local_1f0;
  local_1c0._M_dataplus._M_p = __s;
  memset(&local_c8,0,0x98);
  sigemptyset((sigset_t *)local_c0);
  local_c8 = (_union_1457)0x1;
  while (iVar5 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)&local_180),
        cVar4 = FLAGS_gtest_death_test_use_fork, iVar5 == -1) {
    piVar9 = __errno_location();
    if (*piVar9 != 4) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"CHECK failed: File ","")
      ;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
      local_250._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_250._M_dataplus._M_p == psVar10) {
        local_250.field_2._M_allocated_capacity = *psVar10;
        local_250.field_2._8_8_ = plVar7[3];
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      else {
        local_250.field_2._M_allocated_capacity = *psVar10;
      }
      local_250._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
      local_290._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_290._M_dataplus._M_p == psVar10) {
        local_290.field_2._M_allocated_capacity = *psVar10;
        local_290.field_2._8_8_ = plVar7[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *psVar10;
      }
      local_290._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_1c8[1] = 0x513;
      StreamableToString<int>(&local_210,local_1c8 + 1);
      std::operator+(&local_270,&local_290,&local_210);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_2b0._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2b0._M_dataplus._M_p == psVar10) {
        local_2b0.field_2._M_allocated_capacity = *psVar10;
        local_2b0.field_2._8_8_ = plVar7[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = *psVar10;
      }
      local_2b0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_2d0._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2d0._M_dataplus._M_p == psVar10) {
        local_2d0.field_2._M_allocated_capacity = *psVar10;
        local_2d0.field_2._8_8_ = plVar7[3];
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = *psVar10;
      }
      local_2d0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2f0._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2f0._M_dataplus._M_p == psVar10) {
        local_2f0.field_2._M_allocated_capacity = *psVar10;
        local_2f0.field_2._8_8_ = plVar7[3];
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = *psVar10;
      }
      local_2f0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeathTestAbort(&local_2f0);
    }
  }
  iVar5 = -1;
  if (FLAGS_gtest_death_test_use_fork == '\0') {
    if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
      AssumeRole();
    }
    iVar5 = getpagesize();
    __len = (size_t)(iVar5 * 2);
    __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
    if (__addr == (void *)0xffffffffffffffff) {
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","")
      ;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
      local_290._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_290._M_dataplus._M_p == psVar10) {
        local_290.field_2._M_allocated_capacity = *psVar10;
        local_290.field_2._8_8_ = plVar7[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *psVar10;
      }
      local_290._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_290);
      local_270._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_270._M_dataplus._M_p == psVar10) {
        local_270.field_2._M_allocated_capacity = *psVar10;
        local_270.field_2._8_8_ = plVar7[3];
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = *psVar10;
      }
      local_270._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_210._M_dataplus._M_p._0_4_ = 0x51f;
      StreamableToString<int>(&local_230,(int *)&local_210);
      std::operator+(&local_2b0,&local_270,&local_230);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_2d0._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2d0._M_dataplus._M_p == psVar10) {
        local_2d0.field_2._M_allocated_capacity = *psVar10;
        local_2d0.field_2._8_8_ = plVar7[3];
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = *psVar10;
      }
      local_2d0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2f0._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2f0._M_dataplus._M_p == psVar10) {
        local_2f0.field_2._M_allocated_capacity = *psVar10;
        local_2f0.field_2._8_8_ = plVar7[3];
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = *psVar10;
      }
      local_2f0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeathTestAbort(&local_2f0);
    }
    lVar17 = 0;
    if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
      lVar17 = __len - 0x40;
    }
    if (((uint)(iVar5 * 2) < 0x41) || (((ulong)(lVar17 + (long)__addr) & 0x3f) != 0)) {
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","")
      ;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
      local_290._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_290._M_dataplus._M_p == psVar10) {
        local_290.field_2._M_allocated_capacity = *psVar10;
        local_290.field_2._8_8_ = plVar7[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *psVar10;
      }
      local_290._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_290);
      local_270._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_270._M_dataplus._M_p == psVar10) {
        local_270.field_2._M_allocated_capacity = *psVar10;
        local_270.field_2._8_8_ = plVar7[3];
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = *psVar10;
      }
      local_270._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_210._M_dataplus._M_p._0_4_ = 0x52d;
      StreamableToString<int>(&local_230,(int *)&local_210);
      std::operator+(&local_2b0,&local_270,&local_230);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_2d0._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2d0._M_dataplus._M_p == psVar10) {
        local_2d0.field_2._M_allocated_capacity = *psVar10;
        local_2d0.field_2._8_8_ = plVar7[3];
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = *psVar10;
      }
      local_2d0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2f0._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2f0._M_dataplus._M_p == psVar10) {
        local_2f0.field_2._M_allocated_capacity = *psVar10;
        local_2f0.field_2._8_8_ = plVar7[3];
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = *psVar10;
      }
      local_2f0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeathTestAbort(&local_2f0);
    }
    iVar5 = clone(ExecDeathTestChildMain,(void *)(lVar17 + (long)__addr),0x11,&local_1c0);
    iVar6 = munmap(__addr,__len);
    if (iVar6 == -1) goto LAB_00123e43;
  }
  if ((cVar4 == '\0') || (iVar5 = fork(), iVar5 != 0)) {
    do {
      iVar6 = sigaction(0x1b,(sigaction *)&local_180,(sigaction *)0x0);
      if (iVar6 != -1) {
        if (iVar5 == -1) {
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,"CHECK failed: File ","");
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
          local_290._M_dataplus._M_p = (pointer)*plVar7;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_290._M_dataplus._M_p == psVar10) {
            local_290.field_2._M_allocated_capacity = *psVar10;
            local_290.field_2._8_8_ = plVar7[3];
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          }
          else {
            local_290.field_2._M_allocated_capacity = *psVar10;
          }
          local_290._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_290);
          local_270._M_dataplus._M_p = (pointer)*plVar7;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_270._M_dataplus._M_p == psVar10) {
            local_270.field_2._M_allocated_capacity = *psVar10;
            local_270.field_2._8_8_ = plVar7[3];
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          }
          else {
            local_270.field_2._M_allocated_capacity = *psVar10;
          }
          local_270._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          local_210._M_dataplus._M_p._0_4_ = 0x540;
          StreamableToString<int>(&local_230,(int *)&local_210);
          std::operator+(&local_2b0,&local_270,&local_230);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
          local_2d0._M_dataplus._M_p = (pointer)*plVar7;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_2d0._M_dataplus._M_p == psVar10) {
            local_2d0.field_2._M_allocated_capacity = *psVar10;
            local_2d0.field_2._8_8_ = plVar7[3];
            local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *psVar10;
          }
          local_2d0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
          local_2f0._M_dataplus._M_p = (pointer)*plVar7;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_2f0._M_dataplus._M_p == psVar10) {
            local_2f0.field_2._M_allocated_capacity = *psVar10;
            local_2f0.field_2._8_8_ = plVar7[3];
            local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          }
          else {
            local_2f0.field_2._M_allocated_capacity = *psVar10;
          }
          local_2f0._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          DeathTestAbort(&local_2f0);
        }
        do {
          iVar6 = close(local_1ec);
          if (iVar6 != -1) {
            *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar5;
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_1f0;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            operator_delete__(__s);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_1e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            return OVERSEE_TEST;
          }
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_290,"CHECK failed: File ","");
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_290);
        local_270._M_dataplus._M_p = (pointer)*plVar7;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_270._M_dataplus._M_p == psVar10) {
          local_270.field_2._M_allocated_capacity = *psVar10;
          local_270.field_2._8_8_ = plVar7[3];
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        }
        else {
          local_270.field_2._M_allocated_capacity = *psVar10;
        }
        local_270._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
        local_2b0._M_dataplus._M_p = (pointer)*plVar7;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_2b0._M_dataplus._M_p == psVar10) {
          local_2b0.field_2._M_allocated_capacity = *psVar10;
          local_2b0.field_2._8_8_ = plVar7[3];
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        }
        else {
          local_2b0.field_2._M_allocated_capacity = *psVar10;
        }
        local_2b0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        local_230._M_dataplus._M_p._0_4_ = 0x56f;
        StreamableToString<int>(&local_250,(int *)&local_230);
        std::operator+(&local_2d0,&local_2b0,&local_250);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
        local_2f0._M_dataplus._M_p = (pointer)*plVar7;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_2f0._M_dataplus._M_p == psVar10) {
          local_2f0.field_2._M_allocated_capacity = *psVar10;
          local_2f0.field_2._8_8_ = plVar7[3];
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *psVar10;
        }
        local_2f0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        local_c8.sa_handler = (__sighandler_t)*plVar7;
        p_Var11 = (__sighandler_t)(plVar7 + 2);
        if (local_c8.sa_handler == p_Var11) {
          local_b8 = *(ulong *)p_Var11;
          uStack_b0 = plVar7[3];
          local_c8.sa_handler = (__sighandler_t)&local_b8;
        }
        else {
          local_b8 = *(ulong *)p_Var11;
        }
        local_c0 = (undefined1  [8])plVar7[1];
        *plVar7 = (long)p_Var11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_180.sa_handler = (__sighandler_t)*plVar7;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180.sa_handler == paVar15) {
          local_170[0]._0_8_ = paVar15->_M_allocated_capacity;
          local_170[0]._8_8_ = plVar7[3];
          local_180.sa_handler = (__sighandler_t)local_170;
        }
        else {
          local_170[0]._0_8_ = paVar15->_M_allocated_capacity;
        }
        local_178 = plVar7[1];
        *plVar7 = (long)paVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        DeathTestAbort((string *)&local_180);
      }
      piVar9 = __errno_location();
    } while (*piVar9 == 4);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"CHECK failed: File ","");
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
    local_250._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_250._M_dataplus._M_p == psVar10) {
      local_250.field_2._M_allocated_capacity = *psVar10;
      local_250.field_2._8_8_ = plVar7[3];
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    }
    else {
      local_250.field_2._M_allocated_capacity = *psVar10;
    }
    local_250._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_290._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_290._M_dataplus._M_p == psVar10) {
      local_290.field_2._M_allocated_capacity = *psVar10;
      local_290.field_2._8_8_ = plVar7[3];
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    }
    else {
      local_290.field_2._M_allocated_capacity = *psVar10;
    }
    local_290._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_1c8[1] = 0x53d;
    StreamableToString<int>(&local_210,local_1c8 + 1);
    std::operator+(&local_270,&local_290,&local_210);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_2b0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2b0._M_dataplus._M_p == psVar10) {
      local_2b0.field_2._M_allocated_capacity = *psVar10;
      local_2b0.field_2._8_8_ = plVar7[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *psVar10;
    }
    local_2b0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    local_2d0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2d0._M_dataplus._M_p == psVar10) {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
      local_2d0.field_2._8_8_ = plVar7[3];
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = *psVar10;
    }
    local_2d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
    local_2f0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2f0._M_dataplus._M_p == psVar10) {
      local_2f0.field_2._M_allocated_capacity = *psVar10;
      local_2f0.field_2._8_8_ = plVar7[3];
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = *psVar10;
    }
    local_2f0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    DeathTestAbort(&local_2f0);
  }
  ExecDeathTestChildMain(&local_1c0);
LAB_00123e43:
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_290._M_dataplus._M_p = (pointer)*plVar7;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_290._M_dataplus._M_p == psVar10) {
    local_290.field_2._M_allocated_capacity = *psVar10;
    local_290.field_2._8_8_ = plVar7[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *psVar10;
  }
  local_290._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_290);
  local_270._M_dataplus._M_p = (pointer)*plVar7;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_270._M_dataplus._M_p == psVar10) {
    local_270.field_2._M_allocated_capacity = *psVar10;
    local_270.field_2._8_8_ = plVar7[3];
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = *psVar10;
  }
  local_270._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_210._M_dataplus._M_p._0_4_ = 0x531;
  StreamableToString<int>(&local_230,(int *)&local_210);
  std::operator+(&local_2b0,&local_270,&local_230);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_2d0._M_dataplus._M_p = (pointer)*plVar7;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_2d0._M_dataplus._M_p == psVar10) {
    local_2d0.field_2._M_allocated_capacity = *psVar10;
    local_2d0.field_2._8_8_ = plVar7[3];
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = *psVar10;
  }
  local_2d0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_2f0._M_dataplus._M_p = (pointer)*plVar7;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_2f0._M_dataplus._M_p == psVar10) {
    local_2f0.field_2._M_allocated_capacity = *psVar10;
    local_2f0.field_2._8_8_ = plVar7[3];
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = *psVar10;
  }
  local_2f0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  DeathTestAbort(&local_2f0);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  std::vector<std::string> args = GetArgvsForDeathTestChildProcess();
  args.push_back(filter_flag);
  args.push_back(internal_flag);

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  std::unique_ptr<char*[]> argv = CreateArgvFromArgs(args);
  const pid_t child_pid = ExecDeathTestSpawnChild(argv.get(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}